

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void writeBits(LodePNGBitWriter *writer,uint value,size_t nbits)

{
  byte *pbVar1;
  byte bVar2;
  size_t i;
  size_t sVar3;
  
  if (nbits == 1) {
    bVar2 = (byte)writer->bp;
    if ((writer->bp & 7) == 0) {
      ucvector_push_back(writer->data,'\0');
      bVar2 = (byte)writer->bp;
    }
    pbVar1 = writer->data->data + (writer->data->size - 1);
    *pbVar1 = *pbVar1 | (byte)(value << (bVar2 & 7));
    writer->bp = writer->bp + 1;
  }
  else {
    for (sVar3 = 0; nbits != sVar3; sVar3 = sVar3 + 1) {
      bVar2 = (byte)writer->bp;
      if ((writer->bp & 7) == 0) {
        ucvector_push_back(writer->data,'\0');
        bVar2 = (byte)writer->bp;
      }
      pbVar1 = writer->data->data + (writer->data->size - 1);
      *pbVar1 = *pbVar1 | ((value >> ((uint)sVar3 & 0x1f) & 1) != 0) << (bVar2 & 7);
      writer->bp = writer->bp + 1;
    }
  }
  return;
}

Assistant:

static void writeBits(LodePNGBitWriter* writer, unsigned value, size_t nbits) {
  if(nbits == 1) { /* compiler should statically compile this case if nbits == 1 */
    WRITEBIT(writer, value);
  } else {
    /* TODO: increase output size nly once here rather than in each WRITEBIT */
    size_t i;
    for(i = 0; i != nbits; ++i) {
      WRITEBIT(writer, (unsigned char)((value >> i) & 1));
    }
  }
}